

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_definition.c
# Opt level: O0

void prf_instance_definition_entry_f(prf_node_t *node,prf_state_t *state)

{
  int iVar1;
  void *pvVar2;
  long in_RSI;
  ushort *in_RDI;
  int n;
  int i;
  int local_14;
  
  if (*in_RDI == prf_instance_definition_info.opcode) {
    iVar1 = prf_array_count((void *)0x10be7c);
    local_14 = 0;
    while ((local_14 < iVar1 &&
           (*(ushort **)(*(long *)(in_RSI + 0x40) + (long)local_14 * 8) != in_RDI))) {
      local_14 = local_14 + 1;
    }
    if (local_14 == iVar1) {
      pvVar2 = prf_array_append_ptr(_n,in_RDI);
      *(void **)(in_RSI + 0x40) = pvVar2;
    }
  }
  else {
    prf_error(9,"instance definition entry state method tried on node of type %d.",(ulong)*in_RDI);
  }
  return;
}

Assistant:

static void
prf_instance_definition_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    int i, n;
    assert( node != NULL && state != NULL );

    if ( node->opcode != prf_instance_definition_info.opcode ) {
        prf_error( 9, "instance definition entry state method tried "
                   "on node of type %d.", node->opcode );
        return;
    }
    n = prf_array_count( state->instances );
    for ( i = 0; i < n; i++ )
        if (state->instances[i] == node) break;
    if ( i == n )
        state->instances =
           (prf_node_t **) prf_array_append_ptr( state->instances, node );
}